

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::ArrayMinMaxMethod::~ArrayMinMaxMethod(ArrayMinMaxMethod *this)

{
  ArrayMinMaxMethod *this_local;
  
  ~ArrayMinMaxMethod(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

ArrayMinMaxMethod(const std::string& name, bool isMin) :
        SystemSubroutine(name, SubroutineKind::Function), isMin(isMin) {
        withClauseMode = WithClauseMode::Iterator;
    }